

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binjgb.c
# Opt level: O3

int main(int argc,char **argv)

{
  uint uVar1;
  Result RVar2;
  Bool BVar3;
  EmulatorEvent EVar4;
  uint uVar5;
  char *filename;
  ulong uVar6;
  Ticks ticks;
  long lVar7;
  size_t __n;
  long lVar8;
  StatusText *pSVar9;
  undefined1 uVar10;
  byte bVar11;
  int iVar12;
  uint uVar13;
  Ticks TVar14;
  int iVar15;
  long lVar16;
  bool bVar17;
  undefined1 auVar18 [16];
  u32 ms;
  u32 sec;
  u32 min;
  u32 hr;
  u32 day;
  char buffer [40];
  FileData rom;
  char time [64];
  HostInit host_init;
  uint local_17c;
  uint local_178;
  uint local_174;
  u32 local_170;
  u32 local_16c;
  char *local_168;
  undefined8 local_160;
  undefined1 local_158 [38];
  undefined2 local_132;
  int local_128;
  undefined4 uStack_124;
  undefined4 uStack_120;
  undefined4 uStack_11c;
  FileData local_118;
  EmulatorInit local_108;
  char local_d8 [64];
  undefined1 local_98 [16];
  undefined1 local_88 [16];
  code *local_78;
  code *pcStack_70;
  u32 local_68;
  u32 uStack_64;
  u32 uStack_60;
  f32 fStack_5c;
  RewindInit local_58;
  undefined1 local_48 [16];
  
  read_ini_file();
  parse_arguments(argc,argv);
  RVar2 = file_read_aligned(s_rom_filename,0x8000,&local_118);
  iVar15 = 1;
  if (RVar2 == OK) {
    local_108.rom.data = local_118.data;
    local_108.rom.size = local_118.size;
    local_108.audio_frequency = s_audio_frequency;
    local_108.audio_frames = s_audio_frames;
    local_108.random_seed = s_random_seed;
    local_108.builtin_palette = s_builtin_palette;
    local_108.force_dmg = s_force_dmg;
    local_108.cgb_color_curve = s_cgb_color_curve;
    e = emulator_new(&local_108);
    if (e != (Emulator *)0x0) {
      local_88 = (undefined1  [16])0x0;
      local_98 = (undefined1  [16])0x0;
      pcStack_70 = key_up;
      local_78 = key_down;
      uStack_64 = s_audio_frequency;
      local_68 = s_render_scale;
      uStack_60 = s_audio_frames;
      fStack_5c = s_audio_volume;
      local_58.frames_per_base_state = s_rewind_frames_per_base_state;
      local_58.buffer_capacity = (ulong)s_rewind_buffer_capacity_megabytes << 0x14;
      local_58._12_4_ = 0;
      local_48._8_4_ = s_use_sgb_border;
      local_48._0_8_ = s_read_joypad_filename;
      local_48._12_4_ = 0;
      host = host_new((HostInit *)local_98,e);
      if (host == (Host *)0x0) {
        iVar15 = 1;
        goto LAB_0011335f;
      }
      filename = replace_extension(s_rom_filename,".sav");
      s_save_state_filename = replace_extension(s_rom_filename,".state");
      local_168 = filename;
      emulator_read_ext_ram_from_file(e,filename);
      s_overlay.texture = host_create_texture(host,0xa0,0x90,HOST_TEXTURE_FORMAT_RGBA);
      local_160 = host_get_monitor_refresh_ms(host);
      if (s_running == '\0') {
        local_128 = -0x80000000;
        uStack_124 = 0x80000000;
        uStack_120 = 0x80000000;
        uStack_11c = 0x80000000;
        do {
          BVar3 = host_poll_events(host);
          if (BVar3 == FALSE) break;
          if (s_rewinding == '\x01') {
            uVar6 = (ulong)((float)s_rewind_scale * 70224.0);
            uVar6 = (long)((float)s_rewind_scale * 70224.0 - 9.223372e+18) & (long)uVar6 >> 0x3f |
                    uVar6;
            ticks = emulator_get_ticks(e);
            TVar14 = ticks - uVar6;
            if (uVar6 <= ticks) {
              host_rewind_to_ticks(host,TVar14);
              ticks = TVar14;
            }
            TVar14 = host_get_rewind_oldest_ticks(host);
            local_158[0] = 0x7c;
            lVar7 = (long)(int)(((ticks - TVar14) * 0x25) / (s_rewind_start - TVar14));
            lVar8 = 2;
            do {
              lVar16 = lVar8 + -2;
              auVar18._8_4_ = (int)lVar16;
              auVar18._0_8_ = lVar16;
              auVar18._12_4_ = (int)((ulong)lVar16 >> 0x20);
              auVar18 = (auVar18 | _DAT_00116f30) ^ ram0x001193f0;
              bVar17 = auVar18._4_4_ == local_128 && auVar18._0_4_ < -0x7fffffdb;
              if (bVar17) {
                uVar10 = 0x20;
                if (lVar8 + -1 < lVar7) {
                  uVar10 = 0x3d;
                }
                local_158[lVar8 + -1] = uVar10;
              }
              if (bVar17) {
                uVar10 = 0x20;
                if (lVar8 < lVar7) {
                  uVar10 = 0x3d;
                }
                local_158[lVar8] = uVar10;
              }
              lVar8 = lVar8 + 2;
            } while (lVar8 != 0x28);
            local_132 = 0x7c;
            emulator_ticks_to_time(ticks,&local_16c,&local_170,&local_174,&local_178,&local_17c);
            snprintf(local_d8,0x40,"%u:%02u:%02u.%02u",(ulong)(local_16c * 0x18 + local_170),
                     (ulong)local_174,(ulong)local_178,local_17c / 10);
            __n = strlen(local_d8);
            memcpy(local_158 + (0x27 - __n >> 1),local_d8,__n);
            set_status_text("%s");
          }
          else if (s_paused == FALSE) {
            EVar4 = host_run_ms(host,local_160);
            if ((EVar4 & 0x10) != 0) {
              set_status_text("invalid opcode!");
              s_paused = TRUE;
            }
            if (s_step_frame == '\x01') {
              host_reset_audio(host);
              s_paused = TRUE;
              s_step_frame = '\0';
            }
          }
          host_begin_video(host);
          memset(s_overlay.data,0,0x16800);
          if (s_status_text.timeout != 0) {
            s_status_text.timeout = s_status_text.timeout - 1;
            iVar15 = (int)s_status_text.len;
            if (0x9e < iVar15 * 4 + 2U) {
              __assert_fail("l <= r && t <= b && l >= 0 && r < SCREEN_WIDTH && t >= 0 && b < SCREEN_HEIGHT"
                            ,
                            "/workspace/llm4binary/github/license_c_cmakelists/binji[P]binjgb/src/binjgb.c"
                            ,0x62,"void fill_rect(int, int, int, int, RGBA)");
            }
            iVar12 = 0x88;
            lVar7 = 0x135a24;
            do {
              lVar16 = 0;
              lVar8 = (ulong)(iVar15 * -4 + 0x9c) * -4 + -8;
              do {
                *(undefined4 *)(lVar7 + lVar16 * 4) = 0xffe0e0e0;
                lVar16 = lVar16 + 1;
                lVar8 = lVar8 + -4;
              } while ((iVar15 << 2 | 2U) != (uint)lVar16);
              lVar7 = lVar7 - lVar8;
              iVar12 = iVar12 + 1;
            } while (iVar12 != 0x8f);
            if (s_status_text.data[0] != '\0') {
              uVar5 = 2;
              pSVar9 = &s_status_text;
              bVar11 = s_status_text.data[0];
              do {
                if (0x9d < uVar5) {
                  __assert_fail("x >= 0 && y >= 0 && x + GLYPH_WIDTH <= SCREEN_WIDTH && y + GLYPH_HEIGHT <= SCREEN_HEIGHT"
                                ,
                                "/workspace/llm4binary/github/license_c_cmakelists/binji[P]binjgb/src/binjgb.c"
                                ,0x71,"void draw_char(int, int, RGBA, char)");
                }
                if ('\x1f' < (char)bVar11) {
                  uVar13 = (uint)(s_font[bVar11 - 0x20] >> 1);
                  uVar1 = uVar5 + 0x55a0;
                  if ((s_font[bVar11 - 0x20] & 1) != 0) {
                    uVar1 = uVar5 + 0x5640;
                  }
                  lVar7 = (ulong)uVar1 * 4 + 0x120620;
                  iVar15 = 0;
                  do {
                    lVar7 = lVar7 + 0x274;
                    iVar12 = 3;
                    do {
                      if ((uVar13 & 1) != 0) {
                        *(undefined4 *)(lVar7 + -0x274) = 0xff0000ff;
                      }
                      uVar13 = uVar13 >> 1;
                      lVar7 = lVar7 + 4;
                      iVar12 = iVar12 + -1;
                    } while (iVar12 != 0);
                    iVar15 = iVar15 + 1;
                  } while (iVar15 != 5);
                }
                uVar5 = uVar5 + 4;
                bVar11 = pSVar9->data[1];
                pSVar9 = (StatusText *)(pSVar9->data + 1);
              } while (bVar11 != 0);
            }
            host_upload_texture(host,s_overlay.texture,0xa0,0x90,s_overlay.data);
            host_render_screen_overlay(host,s_overlay.texture);
          }
          host_end_video(host);
        } while (s_running != '\x01');
      }
      if (s_write_joypad_filename == (char *)0x0) {
        emulator_write_ext_ram_to_file(e,local_168);
      }
      else {
        host_write_joypad_to_file(host,s_write_joypad_filename);
      }
      iVar15 = 0;
    }
  }
  if (host != (Host *)0x0) {
    host_delete(host);
  }
LAB_0011335f:
  if (e != (Emulator *)0x0) {
    emulator_delete(e);
  }
  return iVar15;
}

Assistant:

int main(int argc, char** argv) {
  int result = 1;

  read_ini_file();

  parse_arguments(argc, argv);

  FileData rom;
  CHECK(SUCCESS(file_read_aligned(s_rom_filename, MINIMUM_ROM_SIZE, &rom)));

  EmulatorInit emulator_init;
  ZERO_MEMORY(emulator_init);
  emulator_init.rom = rom;
  emulator_init.audio_frequency = s_audio_frequency;
  emulator_init.audio_frames = s_audio_frames;
  emulator_init.random_seed = s_random_seed;
  emulator_init.builtin_palette = s_builtin_palette;
  emulator_init.force_dmg = s_force_dmg;
  emulator_init.cgb_color_curve = s_cgb_color_curve;
  e = emulator_new(&emulator_init);
  CHECK(e != NULL);

  HostInit host_init;
  ZERO_MEMORY(host_init);
  host_init.hooks.key_down = key_down;
  host_init.hooks.key_up = key_up;
  host_init.render_scale = s_render_scale;
  host_init.audio_frequency = s_audio_frequency;
  host_init.audio_frames = s_audio_frames;
  host_init.audio_volume = s_audio_volume;
  host_init.rewind.frames_per_base_state = s_rewind_frames_per_base_state;
  host_init.rewind.buffer_capacity = s_rewind_buffer_capacity_megabytes * MEGABYTES(1);
  host_init.joypad_filename = s_read_joypad_filename;
  host_init.use_sgb_border = s_use_sgb_border;
  host = host_new(&host_init, e);
  CHECK(host != NULL);

  const char* save_filename = replace_extension(s_rom_filename, SAVE_EXTENSION);
  s_save_state_filename =
      replace_extension(s_rom_filename, SAVE_STATE_EXTENSION);
  emulator_read_ext_ram_from_file(e, save_filename);

  s_overlay.texture = host_create_texture(host, SCREEN_WIDTH, SCREEN_HEIGHT,
                                          HOST_TEXTURE_FORMAT_RGBA);

  f64 refresh_ms = host_get_monitor_refresh_ms(host);
  while (s_running && host_poll_events(host)) {
    if (s_rewinding) {
      rewind_by((Ticks)(PPU_FRAME_TICKS * s_rewind_scale));
    } else if (!s_paused) {
      EmulatorEvent event = host_run_ms(host, refresh_ms);
      if (event & EMULATOR_EVENT_INVALID_OPCODE) {
        set_status_text("invalid opcode!");
        s_paused = TRUE;
      }
      if (s_step_frame) {
        host_reset_audio(host);
        s_paused = TRUE;
        s_step_frame = FALSE;
      }
    }

    host_begin_video(host);
    update_overlay();
    host_end_video(host);
  }

  if (s_write_joypad_filename) {
    host_write_joypad_to_file(host, s_write_joypad_filename);
  } else {
    emulator_write_ext_ram_to_file(e, save_filename);
  }

  result = 0;
error:
  if (host) {
    host_delete(host);
  }
  if (e) {
    emulator_delete(e);
  }
  return result;
}